

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_sint64 memoryIo_read(PHYSFS_Io *io,void *buf,PHYSFS_uint64 len)

{
  long *plVar1;
  MemoryIoInfo *pMVar2;
  PHYSFS_uint64 avail;
  MemoryIoInfo *info;
  PHYSFS_uint64 len_local;
  void *buf_local;
  PHYSFS_Io *io_local;
  
  plVar1 = (long *)io->opaque;
  pMVar2 = (MemoryIoInfo *)(plVar1[1] - plVar1[2]);
  if (pMVar2 <= (MemoryIoInfo *)plVar1[1]) {
    if (pMVar2 == (MemoryIoInfo *)0x0) {
      io_local = (PHYSFS_Io *)0x0;
    }
    else {
      info = (MemoryIoInfo *)len;
      if (pMVar2 < len) {
        info = pMVar2;
      }
      memcpy(buf,(void *)(*plVar1 + plVar1[2]),(size_t)info);
      plVar1[2] = (long)&info->buf + plVar1[2];
      io_local = (PHYSFS_Io *)info;
    }
    return (PHYSFS_sint64)io_local;
  }
  __assert_fail("avail <= info->len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                ,0x100,"PHYSFS_sint64 memoryIo_read(PHYSFS_Io *, void *, PHYSFS_uint64)");
}

Assistant:

static PHYSFS_sint64 memoryIo_read(PHYSFS_Io *io, void *buf, PHYSFS_uint64 len)
{
    MemoryIoInfo *info = (MemoryIoInfo *) io->opaque;
    const PHYSFS_uint64 avail = info->len - info->pos;
    assert(avail <= info->len);

    if (avail == 0)
        return 0;  /* we're at EOF; nothing to do. */

    if (len > avail)
        len = avail;

    memcpy(buf, info->buf + info->pos, (size_t) len);
    info->pos += len;
    return len;
}